

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.cpp
# Opt level: O1

ostream * __thiscall Al::internal::ProgressEngine::dump_state(ProgressEngine *this,ostream *ss)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  _Hash_node_base *p_Var6;
  long *local_80;
  long local_78;
  long local_70 [2];
  _Hash_node_base *local_60;
  long local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  p_Var6 = (this->run_queues)._M_h._M_before_begin._M_nxt;
  while (p_Var6 != (_Hash_node_base *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(ss,"Pipelined run queue for stream ",0x1f);
    poVar3 = std::ostream::_M_insert<void_const*>(ss);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":\n",2);
    lVar4 = 0;
    local_60 = p_Var6;
    do {
      p_Var1 = p_Var6[lVar4 * 3 + 3]._M_nxt;
      p_Var2 = p_Var6[lVar4 * 3 + 2]._M_nxt;
      lVar5 = (long)p_Var1 - (long)p_Var2 >> 3;
      std::__ostream_insert<char,std::char_traits<char>>(ss,"Stage ",6);
      local_58 = lVar4;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)ss);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," run queue (",0xc);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"):\n",3);
      if (p_Var1 != p_Var2) {
        p_Var1 = p_Var6 + lVar4 * 3 + 2;
        lVar4 = 0;
        do {
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)ss);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
          if (p_Var1->_M_nxt[lVar4]._M_nxt == (_Hash_node_base *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>(ss,"(unknown)\n",10);
          }
          else {
            (*(code *)(p_Var1->_M_nxt[lVar4]._M_nxt)->_M_nxt[6]._M_nxt)(&local_50);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (ss,(char *)local_50,local_48);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
            (*(code *)(p_Var1->_M_nxt[lVar4]._M_nxt)->_M_nxt[7]._M_nxt)(&local_80);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar3,(char *)local_80,local_78);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
            if (local_80 != local_70) {
              operator_delete(local_80,local_70[0] + 1);
            }
            if (local_50 != local_40) {
              operator_delete(local_50,local_40[0] + 1);
            }
          }
          lVar4 = lVar4 + 1;
        } while (lVar5 + (ulong)(lVar5 == 0) != lVar4);
      }
      lVar4 = local_58 + 1;
    } while (local_58 == 0);
    p_Var6 = local_60->_M_nxt;
  }
  return ss;
}

Assistant:

std::ostream& ProgressEngine::dump_state(std::ostream& ss) {
  // Note: This pulls *directly from internal state*.
  // This is *not* thread safe, and stuff might blow up.
  // You should only be dumping state where you don't care about that anyway.
  for (auto&& stream_pipeline_pair : run_queues) {
    ss << "Pipelined run queue for stream " << stream_pipeline_pair.first << ":\n";
    auto&& pipeline = stream_pipeline_pair.second;
    for (size_t stage = 0; stage < AL_PE_NUM_PIPELINE_STAGES; ++stage) {
      const size_t stage_queue_size = pipeline[stage].size();
      ss << "Stage " << stage << " run queue (" << stage_queue_size << "):\n";
      for (size_t i = 0; i < stage_queue_size; ++i) {
        ss << i << ": ";
        if (pipeline[stage][i]) {
          ss << pipeline[stage][i]->get_name() << " "
             << pipeline[stage][i]->get_desc() << "\n";
        } else {
          ss << "(unknown)\n";
        }
      }
    }
  }
  return ss;
}